

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# search.cc
# Opt level: O1

base_learner * Search::setup(options_i *options,vw *all)

{
  _func_int **pp_Var1;
  undefined **ppuVar2;
  uint uVar3;
  ulong __val;
  _func_void_search_ptr_size_t_ptr_options_i_ptr *p_Var4;
  undefined8 uVar5;
  undefined8 uVar6;
  undefined *puVar7;
  bool bVar8;
  bool bVar9;
  bool bVar10;
  char cVar11;
  char cVar12;
  int iVar13;
  uint uVar14;
  int iVar15;
  search *psVar16;
  search_private *psVar17;
  typed_option<unsigned_long> *ptVar18;
  typed_option<float> *ptVar19;
  vw_exception *pvVar20;
  polylabel *ppVar21;
  undefined **ppuVar22;
  typed_option<unsigned_int> *ptVar23;
  base_learner *base;
  clock_t cVar24;
  learner<Search::search,_std::vector<example_*,_std::allocator<example_*>_>_> *plVar25;
  ostream *poVar26;
  ulong uVar27;
  long lVar28;
  RollMethod RVar29;
  label_parser *plVar30;
  vw *pvVar31;
  options_i *poVar32;
  byte bVar33;
  byte bVar34;
  float fVar35;
  string __str;
  string task_string;
  free_ptr<search> sch;
  stringstream __msg;
  option_group_definition new_options;
  string rollout_string;
  string rollin_string;
  string interpolation_string;
  string metatask_string;
  uint32_t search_trained_nb_policies;
  string search_allowed_transitions;
  string neighbor_features_string;
  char *local_1508;
  uint local_1500;
  char local_14f8 [16];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_14e8;
  options_i *local_14c8;
  code *local_14c0;
  search *local_14b8;
  vw *local_14b0;
  undefined1 local_14a8 [48];
  string local_1478 [64];
  bool local_1438;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_1420;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_1410;
  size_t *local_1320;
  uint32_t *local_1318;
  option_group_definition local_1310;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_12d8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_12b8;
  size_t *local_1298;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1290;
  float *local_1270;
  float *local_1268;
  float *local_1260;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1258;
  uint local_1234;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1230;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1210;
  undefined1 *local_11f0 [2];
  undefined1 local_11e0 [16];
  undefined1 *local_11d0;
  long local_11c8;
  undefined1 local_11c0 [16];
  char *local_11b0;
  uint local_11a8;
  char local_11a0 [16];
  undefined1 *local_1190 [2];
  undefined1 local_1180 [16];
  undefined1 *local_1170 [2];
  undefined1 local_1160 [16];
  string local_1150;
  string local_1130;
  string local_1110;
  string local_10f0;
  string local_10d0;
  string local_10b0;
  string local_1090;
  string local_1070;
  string local_1050;
  string local_1030;
  string local_1010;
  string local_ff0;
  string local_fd0;
  string local_fb0;
  string local_f90;
  string local_f70;
  string local_f50;
  string local_f30;
  string local_f10;
  string local_ef0;
  string local_ed0;
  string local_eb0;
  string local_e90;
  string local_e70;
  string local_e50;
  string local_e30;
  string local_e10;
  typed_option<unsigned_long> local_df0;
  typed_option<float> local_d50;
  typed_option<bool> local_cb0;
  typed_option<float> local_c10;
  typed_option<bool> local_b70;
  typed_option<bool> local_ad0;
  typed_option<unsigned_long> local_a30;
  typed_option<unsigned_long> local_990;
  typed_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_8f0;
  typed_option<float> local_850;
  typed_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_7b0;
  typed_option<unsigned_int> local_710;
  typed_option<unsigned_int> local_670;
  typed_option<float> local_5d0;
  typed_option<float> local_530;
  typed_option<unsigned_long> local_490;
  typed_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_3f0;
  typed_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_350;
  typed_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_2b0;
  typed_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_210;
  typed_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_170;
  typed_option<unsigned_long> local_d0;
  
  bVar34 = 0;
  psVar16 = calloc_or_throw<Search::search>(1);
  psVar17 = calloc_or_throw<Search::search_private>(1);
  psVar16->priv = psVar17;
  local_14c0 = destroy_free<Search::search>;
  psVar17 = psVar16->priv;
  local_14e8._M_dataplus._M_p = (pointer)&local_14e8.field_2;
  local_14e8._M_string_length = 0;
  local_14e8.field_2._M_local_buf[0] = '\0';
  local_1258._M_dataplus._M_p = (pointer)&local_1258.field_2;
  local_1258._M_string_length = 0;
  local_1258.field_2._M_local_buf[0] = '\0';
  local_1290._M_dataplus._M_p = (pointer)&local_1290.field_2;
  local_14b8 = psVar16;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_1290,"data","");
  local_1210._M_dataplus._M_p = (pointer)&local_1210.field_2;
  local_1210._M_string_length = 0;
  local_1210.field_2._M_local_buf[0] = '\0';
  local_12d8._M_dataplus._M_p = (pointer)&local_12d8.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_12d8,"mix_per_state","");
  local_12b8._M_dataplus._M_p = (pointer)&local_12b8.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_12b8,"mix_per_state","");
  local_1230._M_dataplus._M_p = (pointer)&local_1230.field_2;
  local_1230._M_string_length = 0;
  local_1230.field_2._M_local_buf[0] = '\0';
  psVar17->A = 1;
  local_11d0 = local_11c0;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_11d0,"Search options","");
  local_1310.m_name._M_dataplus._M_p = (pointer)&local_1310.m_name.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_1310,local_11d0,local_11d0 + local_11c8);
  local_1310.m_options.
  super__Vector_base<std::shared_ptr<VW::config::base_option>,_std::allocator<std::shared_ptr<VW::config::base_option>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_1310.m_options.
  super__Vector_base<std::shared_ptr<VW::config::base_option>,_std::allocator<std::shared_ptr<VW::config::base_option>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_1310.m_options.
  super__Vector_base<std::shared_ptr<VW::config::base_option>,_std::allocator<std::shared_ptr<VW::config::base_option>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  if (local_11d0 != local_11c0) {
    operator_delete(local_11d0);
  }
  local_eb0._M_dataplus._M_p = (pointer)&local_eb0.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_eb0,"search","");
  local_1320 = &psVar17->A;
  VW::config::typed_option<unsigned_long>::typed_option
            ((typed_option<unsigned_long> *)local_14a8,&local_eb0,local_1320);
  local_1438 = true;
  local_1508 = local_14f8;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_1508,"Use learning to search, argument=maximum action id or 0 for LDF"
             ,"");
  std::__cxx11::string::_M_assign(local_1478);
  VW::config::typed_option<unsigned_long>::typed_option
            (&local_d0,(typed_option<unsigned_long> *)local_14a8);
  VW::config::option_group_definition::add<unsigned_long>(&local_1310,&local_d0);
  local_d0.super_base_option._vptr_base_option = (_func_int **)&PTR__typed_option_002cbf30;
  if (local_d0.m_default_value.super___shared_ptr<unsigned_long,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_d0.m_default_value.
               super___shared_ptr<unsigned_long,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi);
  }
  if (local_d0.m_value.super___shared_ptr<unsigned_long,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_d0.m_value.super___shared_ptr<unsigned_long,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  VW::config::base_option::~base_option(&local_d0.super_base_option);
  if (local_1508 != local_14f8) {
    operator_delete(local_1508);
  }
  local_14a8._0_8_ = &PTR__typed_option_002cbf30;
  if (local_1410._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_1410._M_pi);
  }
  if (local_1420._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_1420._M_pi);
  }
  VW::config::base_option::~base_option((base_option *)local_14a8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_eb0._M_dataplus._M_p != &local_eb0.field_2) {
    operator_delete(local_eb0._M_dataplus._M_p);
  }
  local_ed0._M_dataplus._M_p = (pointer)&local_ed0.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_ed0,"search_task","");
  VW::config::
  typed_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  typed_option((typed_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                *)local_14a8,&local_ed0,&local_14e8);
  local_1438 = true;
  local_1508 = local_14f8;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_1508,
             "the search task (use \"--search_task list\" to get a list of available tasks)","");
  std::__cxx11::string::_M_assign(local_1478);
  VW::config::
  typed_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  typed_option(&local_170,
               (typed_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                *)local_14a8);
  local_14c8 = options;
  local_14b0 = all;
  VW::config::option_group_definition::add<std::__cxx11::string>(&local_1310,&local_170);
  local_170.super_base_option._vptr_base_option = (_func_int **)&PTR__typed_option_002cc008;
  if (local_170.m_default_value.
      super___shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
      ._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_170.m_default_value.
               super___shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
               ._M_refcount._M_pi);
  }
  if (local_170.m_value.
      super___shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
      ._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_170.m_value.
               super___shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
               ._M_refcount._M_pi);
  }
  VW::config::base_option::~base_option(&local_170.super_base_option);
  if (local_1508 != local_14f8) {
    operator_delete(local_1508);
  }
  local_14a8._0_8_ = &PTR__typed_option_002cc008;
  if (local_1410._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_1410._M_pi);
  }
  if (local_1420._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_1420._M_pi);
  }
  VW::config::base_option::~base_option((base_option *)local_14a8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_ed0._M_dataplus._M_p != &local_ed0.field_2) {
    operator_delete(local_ed0._M_dataplus._M_p);
  }
  local_ef0._M_dataplus._M_p = (pointer)&local_ef0.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_ef0,"search_metatask","");
  VW::config::
  typed_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  typed_option((typed_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                *)local_14a8,&local_ef0,&local_1258);
  local_1438 = true;
  local_1508 = local_14f8;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_1508,
             "the search metatask (use \"--search_metatask list\" to get a list of available metatasks)"
             ,"");
  std::__cxx11::string::_M_assign(local_1478);
  VW::config::
  typed_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  typed_option(&local_210,
               (typed_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                *)local_14a8);
  VW::config::option_group_definition::add<std::__cxx11::string>(&local_1310,&local_210);
  local_210.super_base_option._vptr_base_option = (_func_int **)&PTR__typed_option_002cc008;
  if (local_210.m_default_value.
      super___shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
      ._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_210.m_default_value.
               super___shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
               ._M_refcount._M_pi);
  }
  if (local_210.m_value.
      super___shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
      ._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_210.m_value.
               super___shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
               ._M_refcount._M_pi);
  }
  VW::config::base_option::~base_option(&local_210.super_base_option);
  if (local_1508 != local_14f8) {
    operator_delete(local_1508);
  }
  local_14a8._0_8_ = &PTR__typed_option_002cc008;
  if (local_1410._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_1410._M_pi);
  }
  if (local_1420._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_1420._M_pi);
  }
  VW::config::base_option::~base_option((base_option *)local_14a8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_ef0._M_dataplus._M_p != &local_ef0.field_2) {
    operator_delete(local_ef0._M_dataplus._M_p);
  }
  local_f10._M_dataplus._M_p = (pointer)&local_f10.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_f10,"search_interpolation","");
  VW::config::
  typed_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  typed_option((typed_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                *)local_14a8,&local_f10,&local_1290);
  local_1438 = true;
  local_1508 = local_14f8;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_1508,"at what level should interpolation happen? [*data|policy]","");
  std::__cxx11::string::_M_assign(local_1478);
  VW::config::
  typed_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  typed_option(&local_2b0,
               (typed_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                *)local_14a8);
  VW::config::option_group_definition::add<std::__cxx11::string>(&local_1310,&local_2b0);
  local_2b0.super_base_option._vptr_base_option = (_func_int **)&PTR__typed_option_002cc008;
  if (local_2b0.m_default_value.
      super___shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
      ._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_2b0.m_default_value.
               super___shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
               ._M_refcount._M_pi);
  }
  if (local_2b0.m_value.
      super___shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
      ._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_2b0.m_value.
               super___shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
               ._M_refcount._M_pi);
  }
  VW::config::base_option::~base_option(&local_2b0.super_base_option);
  if (local_1508 != local_14f8) {
    operator_delete(local_1508);
  }
  local_14a8._0_8_ = &PTR__typed_option_002cc008;
  if (local_1410._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_1410._M_pi);
  }
  if (local_1420._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_1420._M_pi);
  }
  VW::config::base_option::~base_option((base_option *)local_14a8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_f10._M_dataplus._M_p != &local_f10.field_2) {
    operator_delete(local_f10._M_dataplus._M_p);
  }
  local_f30._M_dataplus._M_p = (pointer)&local_f30.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_f30,"search_rollout","");
  VW::config::
  typed_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  typed_option((typed_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                *)local_14a8,&local_f30,&local_12d8);
  local_1508 = local_14f8;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_1508,
             "how should rollouts be executed?           [policy|oracle|*mix_per_state|mix_per_roll|none]"
             ,"");
  std::__cxx11::string::_M_assign(local_1478);
  VW::config::
  typed_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  typed_option(&local_350,
               (typed_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                *)local_14a8);
  VW::config::option_group_definition::add<std::__cxx11::string>(&local_1310,&local_350);
  local_350.super_base_option._vptr_base_option = (_func_int **)&PTR__typed_option_002cc008;
  if (local_350.m_default_value.
      super___shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
      ._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_350.m_default_value.
               super___shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
               ._M_refcount._M_pi);
  }
  if (local_350.m_value.
      super___shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
      ._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_350.m_value.
               super___shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
               ._M_refcount._M_pi);
  }
  VW::config::base_option::~base_option(&local_350.super_base_option);
  if (local_1508 != local_14f8) {
    operator_delete(local_1508);
  }
  local_14a8._0_8_ = &PTR__typed_option_002cc008;
  if (local_1410._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_1410._M_pi);
  }
  if (local_1420._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_1420._M_pi);
  }
  VW::config::base_option::~base_option((base_option *)local_14a8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_f30._M_dataplus._M_p != &local_f30.field_2) {
    operator_delete(local_f30._M_dataplus._M_p);
  }
  local_f50._M_dataplus._M_p = (pointer)&local_f50.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_f50,"search_rollin","");
  VW::config::
  typed_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  typed_option((typed_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                *)local_14a8,&local_f50,&local_12b8);
  local_1508 = local_14f8;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_1508,
             "how should past trajectories be generated? [policy|oracle|*mix_per_state|mix_per_roll]"
             ,"");
  std::__cxx11::string::_M_assign(local_1478);
  VW::config::
  typed_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  typed_option(&local_3f0,
               (typed_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                *)local_14a8);
  VW::config::option_group_definition::add<std::__cxx11::string>(&local_1310,&local_3f0);
  local_3f0.super_base_option._vptr_base_option = (_func_int **)&PTR__typed_option_002cc008;
  if (local_3f0.m_default_value.
      super___shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
      ._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_3f0.m_default_value.
               super___shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
               ._M_refcount._M_pi);
  }
  if (local_3f0.m_value.
      super___shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
      ._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_3f0.m_value.
               super___shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
               ._M_refcount._M_pi);
  }
  VW::config::base_option::~base_option(&local_3f0.super_base_option);
  if (local_1508 != local_14f8) {
    operator_delete(local_1508);
  }
  local_14a8._0_8_ = &PTR__typed_option_002cc008;
  if (local_1410._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_1410._M_pi);
  }
  if (local_1420._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_1420._M_pi);
  }
  VW::config::base_option::~base_option((base_option *)local_14a8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_f50._M_dataplus._M_p != &local_f50.field_2) {
    operator_delete(local_f50._M_dataplus._M_p);
  }
  local_f70._M_dataplus._M_p = (pointer)&local_f70.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_f70,"search_passes_per_policy","");
  local_1298 = &psVar17->passes_per_policy;
  VW::config::typed_option<unsigned_long>::typed_option
            ((typed_option<unsigned_long> *)local_14a8,&local_f70,local_1298);
  ptVar18 = VW::config::typed_option<unsigned_long>::default_value
                      ((typed_option<unsigned_long> *)local_14a8,1);
  local_1508 = local_14f8;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_1508,
             "number of passes per policy (only valid for search_interpolation=policy)","");
  std::__cxx11::string::_M_assign((string *)&(ptVar18->super_base_option).m_help);
  VW::config::typed_option<unsigned_long>::typed_option(&local_490,ptVar18);
  VW::config::option_group_definition::add<unsigned_long>(&local_1310,&local_490);
  local_490.super_base_option._vptr_base_option = (_func_int **)&PTR__typed_option_002cbf30;
  if (local_490.m_default_value.super___shared_ptr<unsigned_long,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_490.m_default_value.
               super___shared_ptr<unsigned_long,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi);
  }
  if (local_490.m_value.super___shared_ptr<unsigned_long,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_490.m_value.super___shared_ptr<unsigned_long,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  VW::config::base_option::~base_option(&local_490.super_base_option);
  if (local_1508 != local_14f8) {
    operator_delete(local_1508);
  }
  local_14a8._0_8_ = &PTR__typed_option_002cbf30;
  if (local_1410._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_1410._M_pi);
  }
  if (local_1420._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_1420._M_pi);
  }
  VW::config::base_option::~base_option((base_option *)local_14a8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_f70._M_dataplus._M_p != &local_f70.field_2) {
    operator_delete(local_f70._M_dataplus._M_p);
  }
  local_f90._M_dataplus._M_p = (pointer)&local_f90.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_f90,"search_beta","");
  local_1260 = &psVar17->beta;
  VW::config::typed_option<float>::typed_option
            ((typed_option<float> *)local_14a8,&local_f90,local_1260);
  ptVar19 = VW::config::typed_option<float>::default_value((typed_option<float> *)local_14a8,0.5);
  local_1508 = local_14f8;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_1508,
             "interpolation rate for policies (only valid for search_interpolation=policy)","");
  std::__cxx11::string::_M_assign((string *)&(ptVar19->super_base_option).m_help);
  VW::config::typed_option<float>::typed_option(&local_530,ptVar19);
  VW::config::option_group_definition::add<float>(&local_1310,&local_530);
  local_530.super_base_option._vptr_base_option = (_func_int **)&PTR__typed_option_002cbf98;
  if (local_530.m_default_value.super___shared_ptr<float,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_530.m_default_value.super___shared_ptr<float,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  if (local_530.m_value.super___shared_ptr<float,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_530.m_value.super___shared_ptr<float,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
               _M_pi);
  }
  VW::config::base_option::~base_option(&local_530.super_base_option);
  if (local_1508 != local_14f8) {
    operator_delete(local_1508);
  }
  local_14a8._0_8_ = &PTR__typed_option_002cbf98;
  if (local_1410._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_1410._M_pi);
  }
  if (local_1420._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_1420._M_pi);
  }
  VW::config::base_option::~base_option((base_option *)local_14a8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_f90._M_dataplus._M_p != &local_f90.field_2) {
    operator_delete(local_f90._M_dataplus._M_p);
  }
  local_fb0._M_dataplus._M_p = (pointer)&local_fb0.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_fb0,"search_alpha","");
  local_1268 = &psVar17->alpha;
  VW::config::typed_option<float>::typed_option
            ((typed_option<float> *)local_14a8,&local_fb0,local_1268);
  ptVar19 = VW::config::typed_option<float>::default_value((typed_option<float> *)local_14a8,1e-10);
  local_1508 = local_14f8;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_1508,
             "annealed beta = 1-(1-alpha)^t (only valid for search_interpolation=data)","");
  std::__cxx11::string::_M_assign((string *)&(ptVar19->super_base_option).m_help);
  VW::config::typed_option<float>::typed_option(&local_5d0,ptVar19);
  VW::config::option_group_definition::add<float>(&local_1310,&local_5d0);
  local_5d0.super_base_option._vptr_base_option = (_func_int **)&PTR__typed_option_002cbf98;
  if (local_5d0.m_default_value.super___shared_ptr<float,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_5d0.m_default_value.super___shared_ptr<float,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  if (local_5d0.m_value.super___shared_ptr<float,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_5d0.m_value.super___shared_ptr<float,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
               _M_pi);
  }
  VW::config::base_option::~base_option(&local_5d0.super_base_option);
  if (local_1508 != local_14f8) {
    operator_delete(local_1508);
  }
  local_14a8._0_8_ = &PTR__typed_option_002cbf98;
  if (local_1410._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_1410._M_pi);
  }
  if (local_1420._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_1420._M_pi);
  }
  VW::config::base_option::~base_option((base_option *)local_14a8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_fb0._M_dataplus._M_p != &local_fb0.field_2) {
    operator_delete(local_fb0._M_dataplus._M_p);
  }
  local_fd0._M_dataplus._M_p = (pointer)&local_fd0.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_fd0,"search_total_nb_policies","");
  local_1318 = &psVar17->total_number_of_policies;
  VW::config::typed_option<unsigned_int>::typed_option
            ((typed_option<unsigned_int> *)local_14a8,&local_fd0,local_1318);
  local_1508 = local_14f8;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_1508,
             "if we are going to train the policies through multiple separate calls to vw, we need to specify this parameter and tell vw how many policies are eventually going to be trained"
             ,"");
  std::__cxx11::string::_M_assign(local_1478);
  VW::config::typed_option<unsigned_int>::typed_option
            (&local_670,(typed_option<unsigned_int> *)local_14a8);
  VW::config::option_group_definition::add<unsigned_int>(&local_1310,&local_670);
  local_670.super_base_option._vptr_base_option = (_func_int **)&PTR__typed_option_002cc040;
  if (local_670.m_default_value.super___shared_ptr<unsigned_int,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_670.m_default_value.
               super___shared_ptr<unsigned_int,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi);
  }
  if (local_670.m_value.super___shared_ptr<unsigned_int,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_670.m_value.super___shared_ptr<unsigned_int,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  VW::config::base_option::~base_option(&local_670.super_base_option);
  if (local_1508 != local_14f8) {
    operator_delete(local_1508);
  }
  local_14a8._0_8_ = &PTR__typed_option_002cc040;
  if (local_1410._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_1410._M_pi);
  }
  if (local_1420._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_1420._M_pi);
  }
  VW::config::base_option::~base_option((base_option *)local_14a8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_fd0._M_dataplus._M_p != &local_fd0.field_2) {
    operator_delete(local_fd0._M_dataplus._M_p);
  }
  local_ff0._M_dataplus._M_p = (pointer)&local_ff0.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_ff0,"search_trained_nb_policies","");
  VW::config::typed_option<unsigned_int>::typed_option
            ((typed_option<unsigned_int> *)local_14a8,&local_ff0,&local_1234);
  local_1508 = local_14f8;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_1508,"the number of trained policies in a file","");
  std::__cxx11::string::_M_assign(local_1478);
  VW::config::typed_option<unsigned_int>::typed_option
            (&local_710,(typed_option<unsigned_int> *)local_14a8);
  VW::config::option_group_definition::add<unsigned_int>(&local_1310,&local_710);
  local_710.super_base_option._vptr_base_option = (_func_int **)&PTR__typed_option_002cc040;
  if (local_710.m_default_value.super___shared_ptr<unsigned_int,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_710.m_default_value.
               super___shared_ptr<unsigned_int,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi);
  }
  if (local_710.m_value.super___shared_ptr<unsigned_int,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_710.m_value.super___shared_ptr<unsigned_int,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  VW::config::base_option::~base_option(&local_710.super_base_option);
  if (local_1508 != local_14f8) {
    operator_delete(local_1508);
  }
  local_14a8._0_8_ = &PTR__typed_option_002cc040;
  if (local_1410._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_1410._M_pi);
  }
  if (local_1420._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_1420._M_pi);
  }
  VW::config::base_option::~base_option((base_option *)local_14a8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_ff0._M_dataplus._M_p != &local_ff0.field_2) {
    operator_delete(local_ff0._M_dataplus._M_p);
  }
  local_1010._M_dataplus._M_p = (pointer)&local_1010.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_1010,"search_allowed_transitions","");
  VW::config::
  typed_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  typed_option((typed_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                *)local_14a8,&local_1010,&local_1230);
  local_1508 = local_14f8;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_1508,
             "read file of allowed transitions [def: all transitions are allowed]","");
  std::__cxx11::string::_M_assign(local_1478);
  VW::config::
  typed_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  typed_option(&local_7b0,
               (typed_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                *)local_14a8);
  VW::config::option_group_definition::add<std::__cxx11::string>(&local_1310,&local_7b0);
  local_7b0.super_base_option._vptr_base_option = (_func_int **)&PTR__typed_option_002cc008;
  if (local_7b0.m_default_value.
      super___shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
      ._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_7b0.m_default_value.
               super___shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
               ._M_refcount._M_pi);
  }
  if (local_7b0.m_value.
      super___shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
      ._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_7b0.m_value.
               super___shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
               ._M_refcount._M_pi);
  }
  VW::config::base_option::~base_option(&local_7b0.super_base_option);
  if (local_1508 != local_14f8) {
    operator_delete(local_1508);
  }
  local_14a8._0_8_ = &PTR__typed_option_002cc008;
  if (local_1410._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_1410._M_pi);
  }
  if (local_1420._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_1420._M_pi);
  }
  VW::config::base_option::~base_option((base_option *)local_14a8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1010._M_dataplus._M_p != &local_1010.field_2) {
    operator_delete(local_1010._M_dataplus._M_p);
  }
  local_1030._M_dataplus._M_p = (pointer)&local_1030.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_1030,"search_subsample_time","");
  VW::config::typed_option<float>::typed_option
            ((typed_option<float> *)local_14a8,&local_1030,&psVar17->subsample_timesteps);
  local_1508 = local_14f8;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_1508,
             "instead of training at all timesteps, use a subset. if value in (0,1), train on a random v%. if v>=1, train on precisely v steps per example, if v<=-1, use active learning"
             ,"");
  std::__cxx11::string::_M_assign(local_1478);
  VW::config::typed_option<float>::typed_option(&local_850,(typed_option<float> *)local_14a8);
  VW::config::option_group_definition::add<float>(&local_1310,&local_850);
  local_850.super_base_option._vptr_base_option = (_func_int **)&PTR__typed_option_002cbf98;
  if (local_850.m_default_value.super___shared_ptr<float,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_850.m_default_value.super___shared_ptr<float,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  if (local_850.m_value.super___shared_ptr<float,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_850.m_value.super___shared_ptr<float,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
               _M_pi);
  }
  VW::config::base_option::~base_option(&local_850.super_base_option);
  if (local_1508 != local_14f8) {
    operator_delete(local_1508);
  }
  local_14a8._0_8_ = &PTR__typed_option_002cbf98;
  if (local_1410._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_1410._M_pi);
  }
  if (local_1420._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_1420._M_pi);
  }
  VW::config::base_option::~base_option((base_option *)local_14a8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1030._M_dataplus._M_p != &local_1030.field_2) {
    operator_delete(local_1030._M_dataplus._M_p);
  }
  local_1050._M_dataplus._M_p = (pointer)&local_1050.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_1050,"search_neighbor_features","");
  VW::config::
  typed_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  typed_option((typed_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                *)local_14a8,&local_1050,&local_1210);
  local_1438 = true;
  local_1508 = local_14f8;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_1508,
             "copy features from neighboring lines. argument looks like: \'-1:a,+2\' meaning copy previous line namespace a and next next line from namespace _unnamed_, where \',\' separates them"
             ,"");
  std::__cxx11::string::_M_assign(local_1478);
  VW::config::
  typed_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  typed_option(&local_8f0,
               (typed_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                *)local_14a8);
  VW::config::option_group_definition::add<std::__cxx11::string>(&local_1310,&local_8f0);
  local_8f0.super_base_option._vptr_base_option = (_func_int **)&PTR__typed_option_002cc008;
  if (local_8f0.m_default_value.
      super___shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
      ._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_8f0.m_default_value.
               super___shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
               ._M_refcount._M_pi);
  }
  if (local_8f0.m_value.
      super___shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
      ._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_8f0.m_value.
               super___shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
               ._M_refcount._M_pi);
  }
  VW::config::base_option::~base_option(&local_8f0.super_base_option);
  if (local_1508 != local_14f8) {
    operator_delete(local_1508);
  }
  local_14a8._0_8_ = &PTR__typed_option_002cc008;
  if (local_1410._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_1410._M_pi);
  }
  if (local_1420._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_1420._M_pi);
  }
  VW::config::base_option::~base_option((base_option *)local_14a8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1050._M_dataplus._M_p != &local_1050.field_2) {
    operator_delete(local_1050._M_dataplus._M_p);
  }
  local_1070._M_dataplus._M_p = (pointer)&local_1070.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_1070,"search_rollout_num_steps","");
  VW::config::typed_option<unsigned_long>::typed_option
            ((typed_option<unsigned_long> *)local_14a8,&local_1070,&psVar17->rollout_num_steps);
  local_1508 = local_14f8;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_1508,
             "how many calls of \"loss\" before we stop really predicting on rollouts and switch to oracle (default means \"infinite\")"
             ,"");
  std::__cxx11::string::_M_assign(local_1478);
  VW::config::typed_option<unsigned_long>::typed_option
            (&local_990,(typed_option<unsigned_long> *)local_14a8);
  VW::config::option_group_definition::add<unsigned_long>(&local_1310,&local_990);
  local_990.super_base_option._vptr_base_option = (_func_int **)&PTR__typed_option_002cbf30;
  if (local_990.m_default_value.super___shared_ptr<unsigned_long,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_990.m_default_value.
               super___shared_ptr<unsigned_long,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi);
  }
  if (local_990.m_value.super___shared_ptr<unsigned_long,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_990.m_value.super___shared_ptr<unsigned_long,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  VW::config::base_option::~base_option(&local_990.super_base_option);
  if (local_1508 != local_14f8) {
    operator_delete(local_1508);
  }
  local_14a8._0_8_ = &PTR__typed_option_002cbf30;
  if (local_1410._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_1410._M_pi);
  }
  if (local_1420._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_1420._M_pi);
  }
  VW::config::base_option::~base_option((base_option *)local_14a8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1070._M_dataplus._M_p != &local_1070.field_2) {
    operator_delete(local_1070._M_dataplus._M_p);
  }
  local_1090._M_dataplus._M_p = (pointer)&local_1090.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_1090,"search_history_length","");
  VW::config::typed_option<unsigned_long>::typed_option
            ((typed_option<unsigned_long> *)local_14a8,&local_1090,&psVar17->history_length);
  local_1438 = true;
  ptVar18 = VW::config::typed_option<unsigned_long>::default_value
                      ((typed_option<unsigned_long> *)local_14a8,1);
  local_1508 = local_14f8;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_1508,
             "some tasks allow you to specify how much history their depend on; specify that here",
             "");
  std::__cxx11::string::_M_assign((string *)&(ptVar18->super_base_option).m_help);
  VW::config::typed_option<unsigned_long>::typed_option(&local_a30,ptVar18);
  VW::config::option_group_definition::add<unsigned_long>(&local_1310,&local_a30);
  local_a30.super_base_option._vptr_base_option = (_func_int **)&PTR__typed_option_002cbf30;
  if (local_a30.m_default_value.super___shared_ptr<unsigned_long,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_a30.m_default_value.
               super___shared_ptr<unsigned_long,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi);
  }
  if (local_a30.m_value.super___shared_ptr<unsigned_long,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_a30.m_value.super___shared_ptr<unsigned_long,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  VW::config::base_option::~base_option(&local_a30.super_base_option);
  if (local_1508 != local_14f8) {
    operator_delete(local_1508);
  }
  local_14a8._0_8_ = &PTR__typed_option_002cbf30;
  if (local_1410._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_1410._M_pi);
  }
  if (local_1420._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_1420._M_pi);
  }
  VW::config::base_option::~base_option((base_option *)local_14a8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1090._M_dataplus._M_p != &local_1090.field_2) {
    operator_delete(local_1090._M_dataplus._M_p);
  }
  local_10b0._M_dataplus._M_p = (pointer)&local_10b0.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_10b0,"search_no_caching","");
  VW::config::typed_option<bool>::typed_option
            ((typed_option<bool> *)local_14a8,&local_10b0,&psVar17->no_caching);
  local_1508 = local_14f8;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_1508,
             "turn off the built-in caching ability (makes things slower, but technically more safe)"
             ,"");
  std::__cxx11::string::_M_assign(local_1478);
  VW::config::typed_option<bool>::typed_option(&local_ad0,(typed_option<bool> *)local_14a8);
  VW::config::option_group_definition::add<bool>(&local_1310,&local_ad0);
  local_ad0.super_base_option._vptr_base_option = (_func_int **)&PTR__typed_option_002cbfd0;
  if (local_ad0.m_default_value.super___shared_ptr<bool,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_ad0.m_default_value.super___shared_ptr<bool,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  if (local_ad0.m_value.super___shared_ptr<bool,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_ad0.m_value.super___shared_ptr<bool,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
               _M_pi);
  }
  VW::config::base_option::~base_option(&local_ad0.super_base_option);
  if (local_1508 != local_14f8) {
    operator_delete(local_1508);
  }
  local_14a8._0_8_ = &PTR__typed_option_002cbfd0;
  if (local_1410._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_1410._M_pi);
  }
  if (local_1420._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_1420._M_pi);
  }
  VW::config::base_option::~base_option((base_option *)local_14a8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_10b0._M_dataplus._M_p != &local_10b0.field_2) {
    operator_delete(local_10b0._M_dataplus._M_p);
  }
  local_10d0._M_dataplus._M_p = (pointer)&local_10d0.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_10d0,"search_xv","");
  VW::config::typed_option<bool>::typed_option
            ((typed_option<bool> *)local_14a8,&local_10d0,&psVar17->xv);
  local_1508 = local_14f8;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_1508,"train two separate policies, alternating prediction/learning",""
            );
  std::__cxx11::string::_M_assign(local_1478);
  VW::config::typed_option<bool>::typed_option(&local_b70,(typed_option<bool> *)local_14a8);
  VW::config::option_group_definition::add<bool>(&local_1310,&local_b70);
  local_b70.super_base_option._vptr_base_option = (_func_int **)&PTR__typed_option_002cbfd0;
  if (local_b70.m_default_value.super___shared_ptr<bool,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_b70.m_default_value.super___shared_ptr<bool,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  if (local_b70.m_value.super___shared_ptr<bool,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_b70.m_value.super___shared_ptr<bool,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
               _M_pi);
  }
  VW::config::base_option::~base_option(&local_b70.super_base_option);
  if (local_1508 != local_14f8) {
    operator_delete(local_1508);
  }
  local_14a8._0_8_ = &PTR__typed_option_002cbfd0;
  if (local_1410._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_1410._M_pi);
  }
  if (local_1420._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_1420._M_pi);
  }
  VW::config::base_option::~base_option((base_option *)local_14a8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_10d0._M_dataplus._M_p != &local_10d0.field_2) {
    operator_delete(local_10d0._M_dataplus._M_p);
  }
  local_10f0._M_dataplus._M_p = (pointer)&local_10f0.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_10f0,"search_perturb_oracle","");
  VW::config::typed_option<float>::typed_option
            ((typed_option<float> *)local_14a8,&local_10f0,&psVar17->perturb_oracle);
  ptVar19 = VW::config::typed_option<float>::default_value((typed_option<float> *)local_14a8,0.0);
  local_1508 = local_14f8;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_1508,"perturb the oracle on rollin with this probability","");
  std::__cxx11::string::_M_assign((string *)&(ptVar19->super_base_option).m_help);
  VW::config::typed_option<float>::typed_option(&local_c10,ptVar19);
  VW::config::option_group_definition::add<float>(&local_1310,&local_c10);
  local_c10.super_base_option._vptr_base_option = (_func_int **)&PTR__typed_option_002cbf98;
  if (local_c10.m_default_value.super___shared_ptr<float,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_c10.m_default_value.super___shared_ptr<float,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  if (local_c10.m_value.super___shared_ptr<float,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_c10.m_value.super___shared_ptr<float,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
               _M_pi);
  }
  VW::config::base_option::~base_option(&local_c10.super_base_option);
  if (local_1508 != local_14f8) {
    operator_delete(local_1508);
  }
  local_14a8._0_8_ = &PTR__typed_option_002cbf98;
  if (local_1410._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_1410._M_pi);
  }
  if (local_1420._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_1420._M_pi);
  }
  VW::config::base_option::~base_option((base_option *)local_14a8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_10f0._M_dataplus._M_p != &local_10f0.field_2) {
    operator_delete(local_10f0._M_dataplus._M_p);
  }
  local_1110._M_dataplus._M_p = (pointer)&local_1110.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_1110,"search_linear_ordering","")
  ;
  VW::config::typed_option<bool>::typed_option
            ((typed_option<bool> *)local_14a8,&local_1110,&psVar17->linear_ordering);
  local_1508 = local_14f8;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_1508,
             "insist on generating examples in linear order (def: hoopla permutation)","");
  std::__cxx11::string::_M_assign(local_1478);
  VW::config::typed_option<bool>::typed_option(&local_cb0,(typed_option<bool> *)local_14a8);
  VW::config::option_group_definition::add<bool>(&local_1310,&local_cb0);
  local_cb0.super_base_option._vptr_base_option = (_func_int **)&PTR__typed_option_002cbfd0;
  if (local_cb0.m_default_value.super___shared_ptr<bool,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_cb0.m_default_value.super___shared_ptr<bool,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  if (local_cb0.m_value.super___shared_ptr<bool,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_cb0.m_value.super___shared_ptr<bool,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
               _M_pi);
  }
  VW::config::base_option::~base_option(&local_cb0.super_base_option);
  if (local_1508 != local_14f8) {
    operator_delete(local_1508);
  }
  local_14a8._0_8_ = &PTR__typed_option_002cbfd0;
  if (local_1410._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_1410._M_pi);
  }
  pvVar31 = local_14b0;
  poVar32 = local_14c8;
  if (local_1420._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_1420._M_pi);
  }
  VW::config::base_option::~base_option((base_option *)local_14a8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1110._M_dataplus._M_p != &local_1110.field_2) {
    operator_delete(local_1110._M_dataplus._M_p);
  }
  local_1130._M_dataplus._M_p = (pointer)&local_1130.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_1130,"search_active_verify","");
  local_1270 = &psVar17->active_csoaa_verify;
  VW::config::typed_option<float>::typed_option
            ((typed_option<float> *)local_14a8,&local_1130,local_1270);
  local_1508 = local_14f8;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_1508,
             "verify that active learning is doing the right thing (arg = multiplier, should be = cost_range * range_c)"
             ,"");
  std::__cxx11::string::_M_assign(local_1478);
  VW::config::typed_option<float>::typed_option(&local_d50,(typed_option<float> *)local_14a8);
  VW::config::option_group_definition::add<float>(&local_1310,&local_d50);
  local_d50.super_base_option._vptr_base_option = (_func_int **)&PTR__typed_option_002cbf98;
  if (local_d50.m_default_value.super___shared_ptr<float,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_d50.m_default_value.super___shared_ptr<float,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  if (local_d50.m_value.super___shared_ptr<float,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_d50.m_value.super___shared_ptr<float,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
               _M_pi);
  }
  VW::config::base_option::~base_option(&local_d50.super_base_option);
  if (local_1508 != local_14f8) {
    operator_delete(local_1508);
  }
  local_14a8._0_8_ = &PTR__typed_option_002cbf98;
  if (local_1410._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_1410._M_pi);
  }
  if (local_1420._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_1420._M_pi);
  }
  VW::config::base_option::~base_option((base_option *)local_14a8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1130._M_dataplus._M_p != &local_1130.field_2) {
    operator_delete(local_1130._M_dataplus._M_p);
  }
  local_1150._M_dataplus._M_p = (pointer)&local_1150.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_1150,"search_save_every_k_runs","");
  VW::config::typed_option<unsigned_long>::typed_option
            ((typed_option<unsigned_long> *)local_14a8,&local_1150,&psVar17->save_every_k_runs);
  local_1508 = local_14f8;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_1508,"save model every k runs","");
  std::__cxx11::string::_M_assign(local_1478);
  VW::config::typed_option<unsigned_long>::typed_option
            (&local_df0,(typed_option<unsigned_long> *)local_14a8);
  VW::config::option_group_definition::add<unsigned_long>(&local_1310,&local_df0);
  local_df0.super_base_option._vptr_base_option = (_func_int **)&PTR__typed_option_002cbf30;
  if (local_df0.m_default_value.super___shared_ptr<unsigned_long,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_df0.m_default_value.
               super___shared_ptr<unsigned_long,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi);
  }
  if (local_df0.m_value.super___shared_ptr<unsigned_long,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_df0.m_value.super___shared_ptr<unsigned_long,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  VW::config::base_option::~base_option(&local_df0.super_base_option);
  if (local_1508 != local_14f8) {
    operator_delete(local_1508);
  }
  local_14a8._0_8_ = &PTR__typed_option_002cbf30;
  if (local_1410._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_1410._M_pi);
  }
  if (local_1420._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_1420._M_pi);
  }
  VW::config::base_option::~base_option((base_option *)local_14a8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1150._M_dataplus._M_p != &local_1150.field_2) {
    operator_delete(local_1150._M_dataplus._M_p);
  }
  (**poVar32->_vptr_options_i)(poVar32,&local_1310);
  pp_Var1 = (_func_int **)(local_14a8 + 0x10);
  local_14a8._0_8_ = pp_Var1;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_14a8,"search_task","");
  iVar13 = (*poVar32->_vptr_options_i[1])(poVar32,local_14a8);
  if ((char)iVar13 == '\0') {
    if ((_func_int **)local_14a8._0_8_ != pp_Var1) {
      operator_delete((void *)local_14a8._0_8_);
    }
  }
  else {
    iVar13 = std::__cxx11::string::compare((char *)&local_14e8);
    if ((_func_int **)local_14a8._0_8_ != pp_Var1) {
      operator_delete((void *)local_14a8._0_8_);
    }
    if (iVar13 != 0) {
      search_initialize(pvVar31,local_14b8);
      parse_neighbor_features(&local_1210,local_14b8);
      iVar13 = std::__cxx11::string::compare((char *)&local_1290);
      if (iVar13 == 0) {
        psVar17->allow_current_policy = true;
        psVar17->adaptive_beta = true;
        psVar17->passes_per_policy = pvVar31->numpasses;
        if (1 < psVar17->current_policy) {
          psVar17->current_policy = 1;
        }
      }
      else {
        iVar13 = std::__cxx11::string::compare((char *)&local_1290);
        if (iVar13 != 0) {
          std::__cxx11::stringstream::stringstream((stringstream *)local_14a8);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)(local_14a8 + 0x10),
                     "error: --search_interpolation must be \'data\' or \'policy\'",0x38);
          pvVar20 = (vw_exception *)__cxa_allocate_exception(0x38);
          std::__cxx11::stringbuf::str();
          VW::vw_exception::vw_exception
                    (pvVar20,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/kumpera[P]vowpal_wabbit/vowpalwabbit/search.cc"
                     ,0xac6,&local_e10);
          __cxa_throw(pvVar20,&VW::vw_exception::typeinfo,VW::vw_exception::~vw_exception);
        }
      }
      iVar13 = std::__cxx11::string::compare((char *)&local_12d8);
      if ((iVar13 == 0) ||
         (iVar13 = std::__cxx11::string::compare((char *)&local_12d8), iVar13 == 0)) {
        psVar17->rollout_method = POLICY;
      }
      else {
        iVar13 = std::__cxx11::string::compare((char *)&local_12d8);
        if ((iVar13 == 0) ||
           (iVar13 = std::__cxx11::string::compare((char *)&local_12d8), iVar13 == 0)) {
          psVar17->rollout_method = ORACLE;
        }
        else {
          iVar13 = std::__cxx11::string::compare((char *)&local_12d8);
          if (iVar13 == 0) {
            psVar17->rollout_method = MIX_PER_STATE;
          }
          else {
            iVar13 = std::__cxx11::string::compare((char *)&local_12d8);
            if ((iVar13 == 0) ||
               (iVar13 = std::__cxx11::string::compare((char *)&local_12d8), iVar13 == 0)) {
              psVar17->rollout_method = MIX_PER_ROLL;
            }
            else {
              iVar13 = std::__cxx11::string::compare((char *)&local_12d8);
              if (iVar13 != 0) {
                std::__cxx11::stringstream::stringstream((stringstream *)local_14a8);
                std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)(local_14a8 + 0x10),
                           "error: --search_rollout must be \'learn\', \'ref\', \'mix\', \'mix_per_state\' or \'none\'"
                           ,0x50);
                pvVar20 = (vw_exception *)__cxa_allocate_exception(0x38);
                std::__cxx11::stringbuf::str();
                VW::vw_exception::vw_exception
                          (pvVar20,
                           "/workspace/llm4binary/github/license_all_cmakelists_25/kumpera[P]vowpal_wabbit/vowpalwabbit/search.cc"
                           ,0xad6,&local_e30);
                __cxa_throw(pvVar20,&VW::vw_exception::typeinfo,VW::vw_exception::~vw_exception);
              }
              psVar17->rollout_method = NO_ROLLOUT;
              psVar17->no_caching = true;
            }
          }
        }
      }
      iVar13 = std::__cxx11::string::compare((char *)&local_12b8);
      RVar29 = POLICY;
      if ((iVar13 != 0) &&
         (iVar13 = std::__cxx11::string::compare((char *)&local_12b8), iVar13 != 0)) {
        iVar13 = std::__cxx11::string::compare((char *)&local_12b8);
        RVar29 = ORACLE;
        if ((iVar13 != 0) &&
           (iVar13 = std::__cxx11::string::compare((char *)&local_12b8), iVar13 != 0)) {
          iVar13 = std::__cxx11::string::compare((char *)&local_12b8);
          if (iVar13 == 0) {
            RVar29 = MIX_PER_STATE;
          }
          else {
            iVar13 = std::__cxx11::string::compare((char *)&local_12b8);
            RVar29 = MIX_PER_ROLL;
            if ((iVar13 != 0) &&
               (iVar13 = std::__cxx11::string::compare((char *)&local_12b8), iVar13 != 0)) {
              std::__cxx11::stringstream::stringstream((stringstream *)local_14a8);
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)(local_14a8 + 0x10),
                         "error: --search_rollin must be \'learn\', \'ref\', \'mix\' or \'mix_per_state\'"
                         ,0x47);
              pvVar20 = (vw_exception *)__cxa_allocate_exception(0x38);
              std::__cxx11::stringbuf::str();
              VW::vw_exception::vw_exception
                        (pvVar20,
                         "/workspace/llm4binary/github/license_all_cmakelists_25/kumpera[P]vowpal_wabbit/vowpalwabbit/search.cc"
                         ,0xae1,&local_e50);
              __cxa_throw(pvVar20,&VW::vw_exception::typeinfo,VW::vw_exception::~vw_exception);
            }
          }
        }
      }
      psVar17->rollin_method = RVar29;
      ppVar21 = calloc_or_throw<polylabel>(1);
      psVar17->allowed_actions_cache = ppVar21;
      local_14a8._0_8_ = local_14a8 + 0x10;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_14a8,"cb","");
      iVar13 = (*poVar32->_vptr_options_i[1])(poVar32,local_14a8);
      if ((undefined1 *)local_14a8._0_8_ != local_14a8 + 0x10) {
        operator_delete((void *)local_14a8._0_8_);
      }
      psVar17->cb_learner = SUB41(iVar13,0);
      if (SUB41(iVar13,0) == false) {
        ppuVar22 = &COST_SENSITIVE::cs_label;
      }
      else {
        ppuVar22 = &CB::cb_label;
      }
      (*(code *)*ppuVar22)(psVar17->allowed_actions_cache);
      (psVar17->learn_losses).cs.costs.end_array = (wclass *)0x0;
      (psVar17->learn_losses).cs.costs.erase_count = 0;
      (psVar17->learn_losses).cs.costs._begin = (wclass *)0x0;
      (psVar17->learn_losses).cs.costs._end = (wclass *)0x0;
      (psVar17->gte_label).cs.costs._begin = (wclass *)0x0;
      (psVar17->gte_label).cs.costs._end = (wclass *)0x0;
      (psVar17->gte_label).cs.costs.end_array = (wclass *)0x0;
      (psVar17->gte_label).cs.costs.erase_count = 0;
      ensure_param(local_1260,0.0,1.0,0.5,"warning: search_beta must be in (0,1); resetting to 0.5")
      ;
      ensure_param(local_1268,0.0,1.0,1e-10,
                   "warning: search_alpha must be in (0,1); resetting to 1e-10");
      psVar17->num_calls_to_run = 0;
      uVar3 = psVar17->current_policy;
      uVar14 = uVar3;
      if (pvVar31->training == true) {
        fVar35 = ceilf((float)pvVar31->numpasses / (float)*local_1298);
        uVar14 = (int)fVar35 + uVar3;
      }
      if ((*local_1318 < uVar14) && (*local_1318 = uVar14, uVar3 != 0)) {
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cerr,
                   "warning: you\'re attempting to train more classifiers than was allocated initially. Likely to cause bad performance."
                   ,0x73);
        std::ios::widen((char)*(undefined8 *)(std::cerr + -0x18) + '\x18');
        std::ostream::put('\x18');
        std::ostream::flush();
      }
      if ((pvVar31->training == false) && (psVar17->current_policy != 0)) {
        psVar17->current_policy = psVar17->current_policy - 1;
      }
      poVar32 = pvVar31->options;
      local_14a8._0_8_ = local_14a8 + 0x10;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_14a8,"search_trained_nb_policies","");
      uVar3 = psVar17->current_policy;
      cVar12 = '\x01';
      if (9 < uVar3) {
        uVar14 = uVar3;
        cVar11 = '\x04';
        do {
          cVar12 = cVar11;
          if (uVar14 < 100) {
            cVar12 = cVar12 + -2;
            goto LAB_00126059;
          }
          if (uVar14 < 1000) {
            cVar12 = cVar12 + -1;
            goto LAB_00126059;
          }
          if (uVar14 < 10000) goto LAB_00126059;
          bVar8 = 99999 < uVar14;
          uVar14 = uVar14 / 10000;
          cVar11 = cVar12 + '\x04';
        } while (bVar8);
        cVar12 = cVar12 + '\x01';
      }
LAB_00126059:
      local_1508 = local_14f8;
      std::__cxx11::string::_M_construct((ulong)&local_1508,cVar12);
      std::__detail::__to_chars_10_impl<unsigned_int>(local_1508,local_1500,uVar3);
      (*poVar32->_vptr_options_i[6])(poVar32,local_14a8,&local_1508);
      pvVar31 = local_14b0;
      pp_Var1 = (_func_int **)(local_14a8 + 0x10);
      if (local_1508 != local_14f8) {
        operator_delete(local_1508);
      }
      if ((_func_int **)local_14a8._0_8_ != pp_Var1) {
        operator_delete((void *)local_14a8._0_8_);
      }
      poVar32 = pvVar31->options;
      local_14a8._0_8_ = pp_Var1;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_14a8,"search_trained_nb_policies","");
      ptVar23 = VW::config::options_i::get_typed_option<unsigned_int>(poVar32,(string *)local_14a8);
      VW::config::typed_option<unsigned_int>::value(ptVar23,psVar17->current_policy);
      if ((_func_int **)local_14a8._0_8_ != pp_Var1) {
        operator_delete((void *)local_14a8._0_8_);
      }
      poVar32 = pvVar31->options;
      local_14a8._0_8_ = pp_Var1;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_14a8,"search_total_nb_policies","");
      uVar3 = *local_1318;
      cVar12 = '\x01';
      if (9 < uVar3) {
        uVar14 = uVar3;
        cVar11 = '\x04';
        do {
          cVar12 = cVar11;
          if (uVar14 < 100) {
            cVar12 = cVar12 + -2;
            goto LAB_0012617a;
          }
          if (uVar14 < 1000) {
            cVar12 = cVar12 + -1;
            goto LAB_0012617a;
          }
          if (uVar14 < 10000) goto LAB_0012617a;
          bVar8 = 99999 < uVar14;
          uVar14 = uVar14 / 10000;
          cVar11 = cVar12 + '\x04';
        } while (bVar8);
        cVar12 = cVar12 + '\x01';
      }
LAB_0012617a:
      local_1508 = local_14f8;
      std::__cxx11::string::_M_construct((ulong)&local_1508,cVar12);
      std::__detail::__to_chars_10_impl<unsigned_int>(local_1508,local_1500,uVar3);
      (*poVar32->_vptr_options_i[6])(poVar32,local_14a8,&local_1508);
      pvVar31 = local_14b0;
      pp_Var1 = (_func_int **)(local_14a8 + 0x10);
      if (local_1508 != local_14f8) {
        operator_delete(local_1508);
      }
      if ((_func_int **)local_14a8._0_8_ != pp_Var1) {
        operator_delete((void *)local_14a8._0_8_);
      }
      poVar32 = pvVar31->options;
      local_14a8._0_8_ = pp_Var1;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_14a8,"search_total_nb_policies","");
      ptVar23 = VW::config::options_i::get_typed_option<unsigned_int>(poVar32,(string *)local_14a8);
      VW::config::typed_option<unsigned_int>::value(ptVar23,*local_1318);
      if ((_func_int **)local_14a8._0_8_ != pp_Var1) {
        operator_delete((void *)local_14a8._0_8_);
      }
      iVar13 = std::__cxx11::string::compare((char *)&local_14e8);
      if (iVar13 == 0) {
        poVar26 = std::endl<char,std::char_traits<char>>((ostream *)&std::cerr);
        std::__ostream_insert<char,std::char_traits<char>>(poVar26,"available search tasks:",0x17);
        std::endl<char,std::char_traits<char>>(poVar26);
        if (all_tasks != (undefined *)0x0) {
          ppuVar22 = &PTR_task_002d0828;
          do {
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"  ",2);
            poVar26 = std::operator<<((ostream *)&std::cerr,*(char **)ppuVar22[-1]);
            std::endl<char,std::char_traits<char>>(poVar26);
            puVar7 = *ppuVar22;
            ppuVar22 = ppuVar22 + 1;
          } while (puVar7 != (undefined *)0x0);
        }
        std::endl<char,std::char_traits<char>>((ostream *)&std::cerr);
LAB_00126a64:
        exit(0);
      }
      iVar13 = std::__cxx11::string::compare((char *)&local_1258);
      if (iVar13 == 0) {
        poVar26 = std::endl<char,std::char_traits<char>>((ostream *)&std::cerr);
        std::__ostream_insert<char,std::char_traits<char>>
                  (poVar26,"available search metatasks:",0x1b);
        std::endl<char,std::char_traits<char>>(poVar26);
        if (all_metatasks != (undefined *)0x0) {
          ppuVar22 = &PTR_metatask_002d0888;
          do {
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"  ",2);
            poVar26 = std::operator<<((ostream *)&std::cerr,*(char **)ppuVar22[-1]);
            std::endl<char,std::char_traits<char>>(poVar26);
            puVar7 = *ppuVar22;
            ppuVar22 = ppuVar22 + 1;
          } while (puVar7 != (undefined *)0x0);
        }
        std::endl<char,std::char_traits<char>>((ostream *)&std::cerr);
        goto LAB_00126a64;
      }
      if (all_tasks != (undefined *)0x0) {
        ppuVar22 = &all_tasks;
        do {
          iVar13 = std::__cxx11::string::compare((char *)&local_14e8);
          if (iVar13 == 0) {
            psVar17->task = (search_task *)*ppuVar22;
            local_14b8->task_name = *(char **)*ppuVar22;
            break;
          }
          ppuVar2 = ppuVar22 + 1;
          ppuVar22 = ppuVar22 + 1;
        } while (*ppuVar2 != (undefined *)0x0);
      }
      if (psVar17->task == (search_task *)0x0) {
        local_14a8._0_8_ = pp_Var1;
        std::__cxx11::string::_M_construct<char_const*>((string *)local_14a8,"help","");
        iVar13 = (*local_14c8->_vptr_options_i[1])(local_14c8,local_14a8);
        if ((undefined1 *)local_14a8._0_8_ != local_14a8 + 0x10) {
          operator_delete((void *)local_14a8._0_8_);
        }
        if ((char)iVar13 == '\0') {
          std::__cxx11::stringstream::stringstream((stringstream *)local_14a8);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)(local_14a8 + 0x10),"fail: unknown task for --search_task \'",0x26);
          poVar26 = std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)(local_14a8 + 0x10),local_14e8._M_dataplus._M_p,
                               local_14e8._M_string_length);
          std::__ostream_insert<char,std::char_traits<char>>
                    (poVar26,"\'; use --search_task list to get a list",0x27);
          pvVar20 = (vw_exception *)__cxa_allocate_exception(0x38);
          std::__cxx11::stringbuf::str();
          VW::vw_exception::vw_exception
                    (pvVar20,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/kumpera[P]vowpal_wabbit/vowpalwabbit/search.cc"
                     ,0xb36,&local_e70);
          __cxa_throw(pvVar20,&VW::vw_exception::typeinfo,VW::vw_exception::~vw_exception);
        }
      }
      psVar17->metatask = (search_metatask *)0x0;
      if (all_metatasks != (undefined *)0x0) {
        ppuVar22 = &all_metatasks;
        do {
          iVar13 = std::__cxx11::string::compare((char *)&local_1258);
          if (iVar13 == 0) {
            psVar17->metatask = (search_metatask *)*ppuVar22;
            local_14b8->metatask_name = *(char **)*ppuVar22;
            break;
          }
          ppuVar2 = ppuVar22 + 1;
          ppuVar22 = ppuVar22 + 1;
        } while (*ppuVar2 != (undefined *)0x0);
      }
      pvVar31->p->emptylines_separate_examples = true;
      local_14a8._0_8_ = local_14a8 + 0x10;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_14a8,"csoaa","");
      poVar32 = local_14c8;
      iVar13 = (*local_14c8->_vptr_options_i[1])(local_14c8,local_14a8);
      if ((char)iVar13 == '\0') {
        local_1508 = local_14f8;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_1508,"cs_active","");
        iVar15 = (*poVar32->_vptr_options_i[1])(poVar32,&local_1508);
        if ((char)iVar15 != '\0') goto LAB_001263cf;
        local_1170[0] = local_1160;
        std::__cxx11::string::_M_construct<char_const*>((string *)local_1170,"csoaa_ldf","");
        iVar15 = (*local_14c8->_vptr_options_i[1])(local_14c8,local_1170);
        if ((char)iVar15 != '\0') {
          bVar8 = true;
          goto LAB_001263d2;
        }
        local_11f0[0] = local_11e0;
        std::__cxx11::string::_M_construct<char_const*>((string *)local_11f0,"wap_ldf","");
        iVar15 = (*local_14c8->_vptr_options_i[1])(local_14c8,local_11f0);
        if ((char)iVar15 != '\0') {
          bVar8 = true;
          bVar10 = true;
          goto LAB_001263d7;
        }
        local_1190[0] = local_1180;
        std::__cxx11::string::_M_construct<char_const*>((string *)local_1190,"cb","");
        iVar15 = (*local_14c8->_vptr_options_i[1])(local_14c8,local_1190);
        bVar33 = (byte)iVar15 ^ 1;
        bVar8 = true;
        bVar10 = true;
        bVar9 = true;
      }
      else {
LAB_001263cf:
        bVar8 = false;
LAB_001263d2:
        bVar10 = false;
LAB_001263d7:
        bVar9 = false;
        bVar33 = 0;
      }
      if ((bVar9) && (local_1190[0] != local_1180)) {
        operator_delete(local_1190[0]);
      }
      if ((bVar10) && (local_11f0[0] != local_11e0)) {
        operator_delete(local_11f0[0]);
      }
      pvVar31 = local_14b0;
      poVar32 = local_14c8;
      if ((bVar8) && (local_1170[0] != local_1160)) {
        operator_delete(local_1170[0]);
      }
      pp_Var1 = (_func_int **)(local_14a8 + 0x10);
      if (((char)iVar13 == '\0') && (local_1508 != local_14f8)) {
        operator_delete(local_1508);
      }
      if ((_func_int **)local_14a8._0_8_ != pp_Var1) {
        operator_delete((void *)local_14a8._0_8_);
      }
      if (bVar33 != 0) {
        local_14a8._0_8_ = pp_Var1;
        std::__cxx11::string::_M_construct<char_const*>((string *)local_14a8,"csoaa","");
        __val = *local_1320;
        cVar12 = '\x01';
        if (9 < __val) {
          uVar27 = __val;
          cVar11 = '\x04';
          do {
            cVar12 = cVar11;
            if (uVar27 < 100) {
              cVar12 = cVar12 + -2;
              goto LAB_0012658c;
            }
            if (uVar27 < 1000) {
              cVar12 = cVar12 + -1;
              goto LAB_0012658c;
            }
            if (uVar27 < 10000) goto LAB_0012658c;
            bVar8 = 99999 < uVar27;
            uVar27 = uVar27 / 10000;
            cVar11 = cVar12 + '\x04';
          } while (bVar8);
          cVar12 = cVar12 + '\x01';
        }
LAB_0012658c:
        local_11b0 = local_11a0;
        std::__cxx11::string::_M_construct((ulong)&local_11b0,cVar12);
        std::__detail::__to_chars_10_impl<unsigned_long>(local_11b0,local_11a8,__val);
        (*local_14c8->_vptr_options_i[5])(local_14c8,local_14a8,&local_11b0);
        pvVar31 = local_14b0;
        if (local_11b0 != local_11a0) {
          operator_delete(local_11b0);
        }
        poVar32 = local_14c8;
        if ((_func_int **)local_14a8._0_8_ != pp_Var1) {
          operator_delete((void *)local_14a8._0_8_);
        }
      }
      local_14a8._0_8_ = pp_Var1;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_14a8,"cs_active","");
      iVar13 = (*poVar32->_vptr_options_i[1])(poVar32,local_14a8);
      psVar17->active_csoaa = SUB41(iVar13,0);
      if ((_func_int **)local_14a8._0_8_ != pp_Var1) {
        operator_delete((void *)local_14a8._0_8_);
      }
      *local_1270 = -1.0;
      local_14a8._0_8_ = pp_Var1;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_14a8,"search_active_verify","");
      iVar13 = (*poVar32->_vptr_options_i[1])(poVar32,local_14a8);
      if ((undefined1 *)local_14a8._0_8_ != local_14a8 + 0x10) {
        operator_delete((void *)local_14a8._0_8_);
      }
      if (((char)iVar13 != '\0') && (psVar17->active_csoaa == false)) {
        std::__cxx11::stringstream::stringstream((stringstream *)local_14a8);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)(local_14a8 + 0x10),
                   "cannot use --search_active_verify without using --cs_active",0x3b);
        pvVar20 = (vw_exception *)__cxa_allocate_exception(0x38);
        std::__cxx11::stringbuf::str();
        VW::vw_exception::vw_exception
                  (pvVar20,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/kumpera[P]vowpal_wabbit/vowpalwabbit/search.cc"
                   ,0xb4c,&local_e90);
        __cxa_throw(pvVar20,&VW::vw_exception::typeinfo,VW::vw_exception::~vw_exception);
      }
      base = setup_base(pvVar31->options,pvVar31);
      ppuVar22 = &MULTICLASS::mc_label;
      plVar30 = &pvVar31->p->lp;
      for (lVar28 = 9; lVar28 != 0; lVar28 = lVar28 + -1) {
        plVar30->default_label = (_func_void_void_ptr *)*ppuVar22;
        ppuVar22 = ppuVar22 + (ulong)bVar34 * -2 + 1;
        plVar30 = (label_parser *)((long)plVar30 + (ulong)bVar34 * -0x10 + 8);
      }
      pvVar31->label_type = mc;
      if ((psVar17->task != (search_task *)0x0) &&
         (p_Var4 = psVar17->task->initialize,
         p_Var4 != (_func_void_search_ptr_size_t_ptr_options_i_ptr *)0x0)) {
        (*p_Var4)(local_14b8,local_1320,poVar32);
      }
      if ((psVar17->metatask != (search_metatask *)0x0) &&
         (p_Var4 = psVar17->metatask->initialize,
         p_Var4 != (_func_void_search_ptr_size_t_ptr_options_i_ptr *)0x0)) {
        (*p_Var4)(local_14b8,local_1320,poVar32);
      }
      psVar17->meta_t = 0;
      local_14a8._0_8_ = local_14a8 + 0x10;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_14a8,"search_allowed_transitions","");
      iVar13 = (*poVar32->_vptr_options_i[1])(poVar32,local_14a8);
      if ((undefined1 *)local_14a8._0_8_ != local_14a8 + 0x10) {
        operator_delete((void *)local_14a8._0_8_);
      }
      if ((char)iVar13 != '\0') {
        read_allowed_transitions
                  ((v_array<COST_SENSITIVE::label> *)local_14a8,(action)*local_1320,
                   local_1230._M_dataplus._M_p);
      }
      handle_condition_options(pvVar31,&psVar17->acset);
      if (psVar17->allow_current_policy == false) {
        pvVar31->check_holdout_every_n_passes = *local_1298;
      }
      pvVar31->searchstr = &local_14c0;
      cVar24 = clock();
      psVar17->start_clock_time = cVar24;
      if (psVar17->xv == true) {
        psVar17->num_learners = psVar17->num_learners * 3;
      }
      plVar25 = LEARNER::learner<Search::search,std::vector<example*,std::allocator<example*>>>::
                init_learner<LEARNER::learner<char,char>>
                          (local_14b8,base,do_actual_learning<true>,do_actual_learning<false>,
                           (ulong)psVar17->total_number_of_policies * psVar17->num_learners,
                           *(prediction_type_t *)(base + 0xd0));
      local_14b8 = (search *)0x0;
      uVar5 = *(undefined8 *)(plVar25 + 0x18);
      uVar6 = *(undefined8 *)(plVar25 + 0x20);
      *(undefined8 *)(plVar25 + 0x58) = uVar5;
      *(code **)(plVar25 + 0x68) = finish_multiline_example;
      *(undefined8 *)(plVar25 + 0xa0) = uVar5;
      *(undefined8 *)(plVar25 + 0xa8) = uVar6;
      *(code **)(plVar25 + 0xb0) = end_examples;
      *(undefined8 *)(plVar25 + 0xb8) = uVar5;
      *(undefined8 *)(plVar25 + 0xc0) = uVar6;
      *(code **)(plVar25 + 200) = search_finish;
      *(undefined8 *)(plVar25 + 0x88) = uVar5;
      *(undefined8 *)(plVar25 + 0x90) = uVar6;
      *(code **)(plVar25 + 0x98) = end_pass;
      goto LAB_00126890;
    }
  }
  plVar25 = (learner<Search::search,_std::vector<example_*,_std::allocator<example_*>_>_> *)0x0;
LAB_00126890:
  std::
  vector<std::shared_ptr<VW::config::base_option>,_std::allocator<std::shared_ptr<VW::config::base_option>_>_>
  ::~vector(&local_1310.m_options);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1310.m_name._M_dataplus._M_p != &local_1310.m_name.field_2) {
    operator_delete(local_1310.m_name._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1230._M_dataplus._M_p != &local_1230.field_2) {
    operator_delete(local_1230._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_12b8._M_dataplus._M_p != &local_12b8.field_2) {
    operator_delete(local_12b8._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_12d8._M_dataplus._M_p != &local_12d8.field_2) {
    operator_delete(local_12d8._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1210._M_dataplus._M_p != &local_1210.field_2) {
    operator_delete(local_1210._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1290._M_dataplus._M_p != &local_1290.field_2) {
    operator_delete(local_1290._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1258._M_dataplus._M_p != &local_1258.field_2) {
    operator_delete(local_1258._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_14e8._M_dataplus._M_p != &local_14e8.field_2) {
    operator_delete(local_14e8._M_dataplus._M_p);
  }
  if (local_14b8 != (search *)0x0) {
    (*local_14c0)();
  }
  return (base_learner *)plVar25;
}

Assistant:

base_learner* setup(options_i& options, vw& all)
{
  free_ptr<search> sch = scoped_calloc_or_throw<search>();
  search_private& priv = *sch->priv;
  std::string task_string;
  std::string metatask_string;
  std::string interpolation_string = "data";
  std::string neighbor_features_string;
  std::string rollout_string = "mix_per_state";
  std::string rollin_string = "mix_per_state";

  uint32_t search_trained_nb_policies;
  std::string search_allowed_transitions;

  priv.A = 1;
  option_group_definition new_options("Search options");
  new_options.add(
      make_option("search", priv.A).keep().help("Use learning to search, argument=maximum action id or 0 for LDF"));
  new_options.add(make_option("search_task", task_string)
                      .keep()
                      .help("the search task (use \"--search_task list\" to get a list of available tasks)"));
  new_options.add(
      make_option("search_metatask", metatask_string)
          .keep()
          .help("the search metatask (use \"--search_metatask list\" to get a list of available metatasks)"));
  new_options.add(make_option("search_interpolation", interpolation_string)
                      .keep()
                      .help("at what level should interpolation happen? [*data|policy]"));
  new_options.add(
      make_option("search_rollout", rollout_string)
          .help("how should rollouts be executed?           [policy|oracle|*mix_per_state|mix_per_roll|none]"));
  new_options.add(make_option("search_rollin", rollin_string)
                      .help("how should past trajectories be generated? [policy|oracle|*mix_per_state|mix_per_roll]"));
  new_options.add(make_option("search_passes_per_policy", priv.passes_per_policy)
                      .default_value(1)
                      .help("number of passes per policy (only valid for search_interpolation=policy)"));
  new_options.add(make_option("search_beta", priv.beta)
                      .default_value(0.5f)
                      .help("interpolation rate for policies (only valid for search_interpolation=policy)"));
  new_options.add(make_option("search_alpha", priv.alpha)
                      .default_value(1e-10f)
                      .help("annealed beta = 1-(1-alpha)^t (only valid for search_interpolation=data)"));
  new_options.add(make_option("search_total_nb_policies", priv.total_number_of_policies)
                      .help("if we are going to train the policies through multiple separate calls to vw, we need to "
                            "specify this parameter and tell vw how many policies are eventually going to be trained"));
  new_options.add(make_option("search_trained_nb_policies", search_trained_nb_policies)
                      .help("the number of trained policies in a file"));
  new_options.add(make_option("search_allowed_transitions", search_allowed_transitions)
                      .help("read file of allowed transitions [def: all transitions are allowed]"));
  new_options.add(make_option("search_subsample_time", priv.subsample_timesteps)
                      .help("instead of training at all timesteps, use a subset. if value in (0,1), train on a random "
                            "v%. if v>=1, train on precisely v steps per example, if v<=-1, use active learning"));
  new_options.add(
      make_option("search_neighbor_features", neighbor_features_string)
          .keep()
          .help("copy features from neighboring lines. argument looks like: '-1:a,+2' meaning copy previous line "
                "namespace a and next next line from namespace _unnamed_, where ',' separates them"));
  new_options.add(make_option("search_rollout_num_steps", priv.rollout_num_steps)
                      .help("how many calls of \"loss\" before we stop really predicting on rollouts and switch to "
                            "oracle (default means \"infinite\")"));
  new_options.add(make_option("search_history_length", priv.history_length)
                      .keep()
                      .default_value(1)
                      .help("some tasks allow you to specify how much history their depend on; specify that here"));
  new_options.add(make_option("search_no_caching", priv.no_caching)
                      .help("turn off the built-in caching ability (makes things slower, but technically more safe)"));
  new_options.add(
      make_option("search_xv", priv.xv).help("train two separate policies, alternating prediction/learning"));
  new_options.add(make_option("search_perturb_oracle", priv.perturb_oracle)
                      .default_value(0.f)
                      .help("perturb the oracle on rollin with this probability"));
  new_options.add(make_option("search_linear_ordering", priv.linear_ordering)
                      .help("insist on generating examples in linear order (def: hoopla permutation)"));
  new_options.add(make_option("search_active_verify", priv.active_csoaa_verify)
                      .help("verify that active learning is doing the right thing (arg = multiplier, should be = "
                            "cost_range * range_c)"));
  new_options.add(make_option("search_save_every_k_runs", priv.save_every_k_runs).help("save model every k runs"));
  options.add_and_parse(new_options);

  // If hook was passed as the search_task then do not activate reduction. This task can only be used in library form.
  if (!options.was_supplied("search_task") || task_string == "hook")
    return nullptr;

  search_initialize(&all, *sch.get());

  parse_neighbor_features(neighbor_features_string, *sch.get());

  if (interpolation_string.compare("data") == 0)  // run as dagger
  {
    priv.adaptive_beta = true;
    priv.allow_current_policy = true;
    priv.passes_per_policy = all.numpasses;
    if (priv.current_policy > 1)
      priv.current_policy = 1;
  }
  else if (interpolation_string.compare("policy") == 0)
    ;
  else
    THROW("error: --search_interpolation must be 'data' or 'policy'");

  if ((rollout_string.compare("policy") == 0) || (rollout_string.compare("learn") == 0))
    priv.rollout_method = POLICY;
  else if ((rollout_string.compare("oracle") == 0) || (rollout_string.compare("ref") == 0))
    priv.rollout_method = ORACLE;
  else if ((rollout_string.compare("mix_per_state") == 0))
    priv.rollout_method = MIX_PER_STATE;
  else if ((rollout_string.compare("mix_per_roll") == 0) || (rollout_string.compare("mix") == 0))
    priv.rollout_method = MIX_PER_ROLL;
  else if ((rollout_string.compare("none") == 0))
  {
    priv.rollout_method = NO_ROLLOUT;
    priv.no_caching = true;
  }
  else
    THROW("error: --search_rollout must be 'learn', 'ref', 'mix', 'mix_per_state' or 'none'");

  if ((rollin_string.compare("policy") == 0) || (rollin_string.compare("learn") == 0))
    priv.rollin_method = POLICY;
  else if ((rollin_string.compare("oracle") == 0) || (rollin_string.compare("ref") == 0))
    priv.rollin_method = ORACLE;
  else if ((rollin_string.compare("mix_per_state") == 0))
    priv.rollin_method = MIX_PER_STATE;
  else if ((rollin_string.compare("mix_per_roll") == 0) || (rollin_string.compare("mix") == 0))
    priv.rollin_method = MIX_PER_ROLL;
  else
    THROW("error: --search_rollin must be 'learn', 'ref', 'mix' or 'mix_per_state'");

  // check if the base learner is contextual bandit, in which case, we dont rollout all actions.
  priv.allowed_actions_cache = &calloc_or_throw<polylabel>();
  if (options.was_supplied("cb"))
  {
    priv.cb_learner = true;
    CB::cb_label.default_label(priv.allowed_actions_cache);
    priv.learn_losses.cb.costs = v_init<CB::cb_class>();
    priv.gte_label.cb.costs = v_init<CB::cb_class>();
  }
  else
  {
    priv.cb_learner = false;
    CS::cs_label.default_label(priv.allowed_actions_cache);
    priv.learn_losses.cs.costs = v_init<CS::wclass>();
    priv.gte_label.cs.costs = v_init<CS::wclass>();
  }

  ensure_param(priv.beta, 0.0, 1.0, 0.5, "warning: search_beta must be in (0,1); resetting to 0.5");
  ensure_param(priv.alpha, 0.0, 1.0, 1e-10f, "warning: search_alpha must be in (0,1); resetting to 1e-10");

  priv.num_calls_to_run = 0;

  // compute total number of policies we will have at end of training
  // we add current_policy for cases where we start from an initial set of policies loaded through -i option
  uint32_t tmp_number_of_policies = priv.current_policy;
  if (all.training)
    tmp_number_of_policies += (int)ceil(((float)all.numpasses) / ((float)priv.passes_per_policy));

  // the user might have specified the number of policies that will eventually be trained through multiple vw calls,
  // so only set total_number_of_policies to computed value if it is larger
  cdbg << "current_policy=" << priv.current_policy << " tmp_number_of_policies=" << tmp_number_of_policies
       << " total_number_of_policies=" << priv.total_number_of_policies << endl;
  if (tmp_number_of_policies > priv.total_number_of_policies)
  {
    priv.total_number_of_policies = tmp_number_of_policies;
    if (priv.current_policy >
        0)  // we loaded a file but total number of policies didn't match what is needed for training
      std::cerr << "warning: you're attempting to train more classifiers than was allocated initially. Likely to cause "
                   "bad performance."
                << endl;
  }

  // current policy currently points to a new policy we would train
  // if we are not training and loaded a bunch of policies for testing, we need to subtract 1 from current policy
  // so that we only use those loaded when testing (as run_prediction is called with allow_current to true)
  if (!all.training && priv.current_policy > 0)
    priv.current_policy--;

  all.options->replace("search_trained_nb_policies", std::to_string(priv.current_policy));
  all.options->get_typed_option<uint32_t>("search_trained_nb_policies").value(priv.current_policy);

  all.options->replace("search_total_nb_policies", std::to_string(priv.total_number_of_policies));
  all.options->get_typed_option<uint32_t>("search_total_nb_policies").value(priv.total_number_of_policies);

  cdbg << "search current_policy = " << priv.current_policy
       << " total_number_of_policies = " << priv.total_number_of_policies << endl;

  if (task_string.compare("list") == 0)
  {
    std::cerr << endl << "available search tasks:" << endl;
    for (search_task** mytask = all_tasks; *mytask != nullptr; mytask++)
      std::cerr << "  " << (*mytask)->task_name << endl;
    std::cerr << endl;
    exit(0);
  }
  if (metatask_string.compare("list") == 0)
  {
    std::cerr << endl << "available search metatasks:" << endl;
    for (search_metatask** mytask = all_metatasks; *mytask != nullptr; mytask++)
      std::cerr << "  " << (*mytask)->metatask_name << endl;
    std::cerr << endl;
    exit(0);
  }
  for (search_task** mytask = all_tasks; *mytask != nullptr; mytask++)
    if (task_string.compare((*mytask)->task_name) == 0)
    {
      priv.task = *mytask;
      sch->task_name = (*mytask)->task_name;
      break;
    }
  if (priv.task == nullptr)
  {
    if (!options.was_supplied("help"))
      THROW("fail: unknown task for --search_task '" << task_string << "'; use --search_task list to get a list");
  }
  priv.metatask = nullptr;
  for (search_metatask** mytask = all_metatasks; *mytask != nullptr; mytask++)
    if (metatask_string.compare((*mytask)->metatask_name) == 0)
    {
      priv.metatask = *mytask;
      sch->metatask_name = (*mytask)->metatask_name;
      break;
    }
  all.p->emptylines_separate_examples = true;

  if (!options.was_supplied("csoaa") && !options.was_supplied("cs_active") && !options.was_supplied("csoaa_ldf") &&
      !options.was_supplied("wap_ldf") && !options.was_supplied("cb"))
  {
    options.insert("csoaa", std::to_string(priv.A));
  }

  priv.active_csoaa = options.was_supplied("cs_active");
  priv.active_csoaa_verify = -1.;
  if (options.was_supplied("search_active_verify"))
    if (!priv.active_csoaa)
      THROW("cannot use --search_active_verify without using --cs_active");

  cdbg << "active_csoaa = " << priv.active_csoaa << ", active_csoaa_verify = " << priv.active_csoaa_verify << endl;

  base_learner* base = setup_base(*all.options, all);

  // default to OAA labels unless the task wants to override this (which they can do in initialize)
  all.p->lp = MC::mc_label;
  all.label_type = label_type::mc;
  if (priv.task && priv.task->initialize)
    priv.task->initialize(*sch.get(), priv.A, options);
  if (priv.metatask && priv.metatask->initialize)
    priv.metatask->initialize(*sch.get(), priv.A, options);
  priv.meta_t = 0;

  if (options.was_supplied("search_allowed_transitions"))
    read_allowed_transitions((action)priv.A, search_allowed_transitions.c_str());

  // set up auto-history (used to only do this if AUTO_CONDITION_FEATURES was on, but that doesn't work for hooktask)
  handle_condition_options(all, priv.acset);

  if (!priv.allow_current_policy)  // if we're not dagger
    all.check_holdout_every_n_passes = priv.passes_per_policy;

  all.searchstr = &sch;

  priv.start_clock_time = clock();

  if (priv.xv)
    priv.num_learners *= 3;

  cdbg << "num_learners = " << priv.num_learners << endl;

  learner<search, multi_ex>& l = init_learner(sch, make_base(*base), do_actual_learning<true>,
      do_actual_learning<false>, priv.total_number_of_policies * priv.num_learners);
  l.set_finish_example(finish_multiline_example);
  l.set_end_examples(end_examples);
  l.set_finish(search_finish);
  l.set_end_pass(end_pass);
  return make_base(l);
}